

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

_Bool borg_has_distance_attack(void)

{
  wchar_t wVar1;
  bool bVar2;
  
  wVar1 = borg_attack_aux_spell_bolt(MAGIC_MISSILE,L'\0',L'\n',L'\0',(uint)z_info->max_range,false);
  bVar2 = true;
  if (wVar1 < L'\x01') {
    wVar1 = borg_attack_aux_spell_bolt
                      (NETHER_BOLT,L'\0',L'\n',L'\x13',(uint)z_info->max_range,false);
    if (wVar1 < L'\x01') {
      wVar1 = borg_attack_aux_launch();
      bVar2 = L'\0' < wVar1;
    }
  }
  return bVar2;
}

Assistant:

static bool borg_has_distance_attack(void)
{
    /* line up Magic Missile shots (covers Mages) */
    if (borg_attack_aux_spell_bolt(
            MAGIC_MISSILE, 0, 10, BORG_ATTACK_MISSILE, z_info->max_range, false)
        > 0)
        return true;

    /* line up Nether Bolt shots (covers Necromancers) */
    if (borg_attack_aux_spell_bolt(
            NETHER_BOLT, 0, 10, BORG_ATTACK_NETHER, z_info->max_range, false)
        > 0)
        return true;

    /* or arrows (covers warrior/ranger/paladins/rogues) */
    if (borg_attack_aux_launch() > 0)
        return true;

    /* not lining up Priests (OOD has area of effect, will line up more
     * naturally) */
    /* or Druids (Stinking cloud is area of effect again) */
    /* Blackguards should be doing HTH */

    return false;
}